

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

ptags * lest::for_test<lest::ptags>(tests *specification,texts *in,ptags *perform,int n)

{
  bool bVar1;
  uint uVar2;
  int in_ECX;
  fd_set *__exceptfds;
  ptags *in_RDX;
  fd_set *__writefds;
  timeval *in_R8;
  ptags *unaff_retaddr;
  test *testing;
  iterator pos;
  int i;
  test *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  string local_68 [32];
  reference local_48;
  test *local_40;
  test *local_38;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> local_30;
  int local_28;
  int local_24;
  ptags *local_20;
  test *in_stack_fffffffffffffff8;
  
  local_28 = 0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  do {
    uVar2 = indefinite(local_24);
    __exceptfds = (fd_set *)(ulong)uVar2;
    if (uVar2 == 0 && local_24 <= local_28) {
      return local_20;
    }
    local_38 = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::begin
                                 ((vector<lest::test,_std::allocator<lest::test>_> *)
                                  in_stack_ffffffffffffff08);
    local_30._M_current = local_38;
    while( true ) {
      local_40 = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::end
                                   ((vector<lest::test,_std::allocator<lest::test>_> *)
                                    in_stack_ffffffffffffff08);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         (__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                 ::operator*(&local_30);
      std::__cxx11::string::string(local_68,(string *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar2 = select((int)local_68,(fd_set *)&stack0xffffffffffffff80,__writefds,__exceptfds,in_R8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_ffffffffffffff20);
      std::__cxx11::string::~string(local_68);
      if ((uVar2 & 1) != 0) {
        in_stack_ffffffffffffff20 = &local_b8;
        test::test((test *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        ptags::operator()(unaff_retaddr,in_stack_fffffffffffffff8);
        in_stack_ffffffffffffff17 = abort<lest::ptags>((ptags *)0x108ab3);
        test::~test((test *)0x108ac3);
        if ((in_stack_ffffffffffffff17 & 1) != 0) {
          return local_20;
        }
      }
      __gnu_cxx::
      __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>::
      operator++(&local_30);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}